

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_rep(lua_State *L)

{
  char *s_00;
  lua_Integer lVar1;
  int local_203c;
  int n;
  char *s;
  luaL_Buffer b;
  size_t l;
  lua_State *L_local;
  
  s_00 = luaL_checklstring(L,1,(size_t *)(b.buffer + 0x1ff8));
  lVar1 = luaL_checkinteger(L,2);
  luaL_buffinit(L,(luaL_Buffer *)&s);
  local_203c = (int)lVar1;
  while (0 < local_203c) {
    luaL_addlstring((luaL_Buffer *)&s,s_00,b.buffer._8184_8_);
    local_203c = local_203c + -1;
  }
  luaL_pushresult((luaL_Buffer *)&s);
  return 1;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  int n = luaL_checkint(L, 2);
  luaL_buffinit(L, &b);
  while (n-- > 0)
    luaL_addlstring(&b, s, l);
  luaL_pushresult(&b);
  return 1;
}